

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O0

bool __thiscall pbrt::Integrator::Unoccluded(Integrator *this,Interaction *p0,Interaction *p1)

{
  bool bVar1;
  undefined8 in_RDI;
  Float tMax;
  Interaction *in_stack_00000080;
  Interaction *in_stack_00000088;
  Ray *in_stack_ffffffffffffffc0;
  Integrator *in_stack_ffffffffffffffc8;
  
  tMax = (Float)((ulong)in_RDI >> 0x20);
  Interaction::SpawnRayTo(in_stack_00000088,in_stack_00000080);
  bVar1 = IntersectP(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,tMax);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool Unoccluded(const Interaction &p0, const Interaction &p1) const {
        return !IntersectP(p0.SpawnRayTo(p1), 1 - ShadowEpsilon);
    }